

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  lua_Integer lVar7;
  char *e;
  char *pcVar8;
  void *pvVar9;
  ushort **ppuVar10;
  size_t l_00;
  char cVar11;
  lua_Integer n;
  lua_State *plVar12;
  ulong uVar13;
  char *s;
  size_t l;
  size_t lp;
  size_t srcl;
  luaL_Buffer b;
  MatchState ms;
  uint local_6d4;
  char *local_6c0;
  lua_State *local_6b8;
  size_t local_6b0;
  ulong local_6a8;
  char *local_6a0;
  lua_State *local_698;
  size_t local_690;
  size_t local_688;
  char *local_680;
  luaL_Buffer local_678;
  MatchState local_258;
  
  pcVar5 = luaL_checklstring(L,1,&local_688);
  pcVar6 = luaL_checklstring(L,2,&local_6b0);
  uVar3 = lua_type(L,3);
  uVar13 = (ulong)uVar3;
  lVar7 = luaL_optinteger(L,4,local_688 + 1);
  cVar1 = *pcVar6;
  if (3 < uVar3 - 3) {
    luaL_typeerror(L,3,"string/function/table");
  }
  luaL_buffinit(L,&local_678);
  if (cVar1 == '^') {
    pcVar6 = pcVar6 + 1;
    local_6b0 = local_6b0 - 1;
  }
  local_258.matchdepth = 200;
  local_258.src_end = pcVar5 + local_688;
  local_258.p_end = pcVar6 + local_6b0;
  n = 0;
  local_6d4 = 0;
  pcVar8 = (char *)0x0;
  local_6b8 = L;
  local_6a8 = uVar13;
  local_6a0 = pcVar6;
  local_258.src_init = pcVar5;
  local_258.L = L;
  do {
    if (lVar7 <= n) break;
    local_258.level = 0;
    e = match(&local_258,pcVar5,pcVar6);
    plVar12 = local_258.L;
    if (e == pcVar8 || e == (char *)0x0) {
      if (local_258.src_end <= pcVar5) break;
      if (local_678.size <= local_678.n) {
        luaL_prepbuffsize(&local_678,1);
      }
      local_678.b[local_678.n] = *pcVar5;
      e = pcVar8;
      pcVar5 = pcVar5 + 1;
      local_678.n = local_678.n + 1;
    }
    else {
      if ((int)uVar13 == 5) {
        push_onecapture(&local_258,0,pcVar5,e);
        lua_gettable(plVar12,3);
LAB_0011954b:
        iVar4 = lua_toboolean(plVar12,-1);
        if (iVar4 == 0) {
          lua_settop(plVar12,-2);
          luaL_addlstring(&local_678,pcVar5,(long)e - (long)pcVar5);
          uVar3 = 0;
        }
        else {
          iVar4 = lua_isstring(plVar12,-1);
          if (iVar4 == 0) {
            iVar4 = lua_type(plVar12,-1);
            pcVar5 = lua_typename(plVar12,iVar4);
            uVar3 = luaL_error(plVar12,"invalid replacement value (a %s)",pcVar5);
          }
          else {
            luaL_addvalue(&local_678);
            uVar3 = 1;
          }
        }
      }
      else {
        if ((int)uVar13 == 6) {
          lua_pushvalue(local_258.L,3);
          iVar4 = push_captures(&local_258,pcVar5,e);
          lua_callk(plVar12,iVar4,1,0,(lua_KFunction)0x0);
          goto LAB_0011954b;
        }
        local_698 = local_258.L;
        pcVar8 = lua_tolstring(local_258.L,3,(size_t *)&local_6c0);
        pcVar6 = local_6c0;
        pvVar9 = memchr(pcVar8,0x25,(size_t)local_6c0);
        if (pvVar9 != (void *)0x0) {
          local_690 = (long)e - (long)pcVar5;
          s = pcVar8;
          do {
            luaL_addlstring(&local_678,s,(long)pvVar9 - (long)s);
            bVar2 = *(byte *)((long)pvVar9 + 1);
            l_00 = local_690;
            pcVar6 = pcVar5;
            if (bVar2 == 0x30) {
LAB_0011963e:
              luaL_addlstring(&local_678,pcVar6,l_00);
            }
            else if (bVar2 == 0x25) {
              cVar11 = '%';
              if (local_678.size <= local_678.n) {
                luaL_prepbuffsize(&local_678,1);
                cVar11 = *(char *)((long)pvVar9 + 1);
              }
              local_678.b[local_678.n] = cVar11;
              local_678.n = local_678.n + 1;
            }
            else {
              ppuVar10 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar10 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                luaL_error(local_698,"invalid use of \'%c\' in replacement string",0x25);
              }
              else {
                l_00 = get_onecapture(&local_258,(char)bVar2 + -0x31,pcVar5,e,&local_680);
                pcVar6 = local_680;
                if (l_00 != 0xfffffffffffffffe) goto LAB_0011963e;
                luaL_addvalue(&local_678);
              }
            }
            pcVar8 = (char *)((long)pvVar9 + 2);
            pcVar6 = s + ((long)local_6c0 - (long)pcVar8);
            local_6c0 = pcVar6;
            pvVar9 = memchr(pcVar8,0x25,(size_t)pcVar6);
            s = pcVar8;
          } while (pvVar9 != (void *)0x0);
        }
        luaL_addlstring(&local_678,pcVar8,(size_t)pcVar6);
        uVar3 = 1;
        uVar13 = local_6a8;
        pcVar6 = local_6a0;
      }
      n = n + 1;
      local_6d4 = local_6d4 | uVar3;
      pcVar5 = e;
    }
    pcVar8 = e;
  } while (cVar1 != '^');
  plVar12 = local_6b8;
  if (local_6d4 == 0) {
    lua_pushvalue(local_6b8,1);
  }
  else {
    luaL_addlstring(&local_678,pcVar5,(long)local_258.src_end - (long)pcVar5);
    luaL_pushresult(&local_678);
    plVar12 = local_6b8;
  }
  lua_pushinteger(plVar12,n);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
  const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
  const char *lastmatch = NULL;  /* end of last match */
  int tr = lua_type(L, 3);  /* replacement type */
  /* max replacements */
  lua_Integer max_s = luaL_optinteger(L, 4, cast_st2S(srcl) + 1);
  int anchor = (*p == '^');
  lua_Integer n = 0;  /* replacement count */
  int changed = 0;  /* change flag */
  MatchState ms;
  luaL_Buffer b;
  luaL_argexpected(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  prepstate(&ms, L, src, srcl, p, lp);
  while (n < max_s) {
    const char *e;
    reprepstate(&ms);  /* (re)prepare state for new match */
    if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
      n++;
      changed = add_value(&ms, &b, src, e, tr) | changed;
      src = lastmatch = e;
    }
    else if (src < ms.src_end)  /* otherwise, skip one character */
      luaL_addchar(&b, *src++);
    else break;  /* end of subject */
    if (anchor) break;
  }
  if (!changed)  /* no changes? */
    lua_pushvalue(L, 1);  /* return original string */
  else {  /* something changed */
    luaL_addlstring(&b, src, ct_diff2sz(ms.src_end - src));
    luaL_pushresult(&b);  /* create and return new string */
  }
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}